

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double half_normal_cdf_inv(double cdf,double a,double b)

{
  double dVar1;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar1 = normal_cdf_inv((cdf + 1.0) * 0.5,a,b);
    return dVar1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"HALF_NORMAL_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double half_normal_cdf_inv ( double cdf, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    HALF_NORMAL_CDF_INV inverts the Half Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 < B.
//
//    Output, double HALF_NORMAL_CDF_INV, the corresponding argument.
//
{
  double cdf2;
  double x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "HALF_NORMAL_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  cdf2 = 0.5 * ( cdf + 1.0 );

  x = normal_cdf_inv ( cdf2, a, b );

  return x;
}